

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O1

void __thiscall basisu::etc_block::get_block_colors_etc1s(etc_block *this,color_rgba *pBlock_colors)

{
  uint64_t uVar1;
  uint uVar2;
  undefined8 in_RAX;
  int iVar3;
  uint uVar4;
  uint8_t uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint8_t uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  color_rgba b;
  undefined8 uStack_28;
  
  uVar1 = (this->field_0).m_uint64;
  auVar11._0_2_ = (ushort)uVar1 >> 3;
  auVar11._2_2_ = (ushort)(uVar1 >> 0x10) >> 3;
  auVar11._4_2_ = (ushort)(uVar1 >> 0x20) >> 3;
  auVar11._6_2_ = (ushort)(uVar1 >> 0x33);
  auVar11._8_8_ = 0;
  auVar11 = pmovzxbw(auVar11 & _DAT_00325090,auVar11 & _DAT_00325090);
  auVar12 = psllw(auVar11,10);
  auVar11 = psllw(auVar11,5);
  uStack_28 = in_RAX;
  unpack_color5((color_rgba *)((long)&uStack_28 + 4),
                auVar12._0_2_ | auVar11._2_2_ | (ushort)((this->field_0).m_bytes[2] >> 3),true);
  uVar6 = (ulong)((this->field_0).m_bytes[3] >> 1 & 0xfffffff0);
  uVar2 = (uint)uStack_28._4_1_;
  iVar7 = *(int *)(g_etc1_inten_tables + uVar6);
  iVar9 = iVar7 + uVar2;
  if (0xfe < (int)(iVar7 + uVar2)) {
    iVar9 = 0xff;
  }
  iVar3 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  uVar4 = (uint)uStack_28._5_1_;
  iVar8 = iVar7 + uVar4;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar10 = (uint8_t)iVar8;
  if (iVar8 < 1) {
    uVar10 = '\0';
  }
  iVar7 = iVar7 + (uint)uStack_28._6_1_;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = iVar3;
  }
  iVar8 = *(int *)(g_etc1_inten_tables + uVar6 + 4);
  (pBlock_colors->field_0).m_comps[0] = (uint8_t)iVar9;
  (pBlock_colors->field_0).m_comps[1] = uVar10;
  (pBlock_colors->field_0).m_comps[2] = (uint8_t)iVar7;
  iVar7 = iVar8 + uVar2;
  if (0xfe < (int)(iVar8 + uVar2)) {
    iVar7 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar9 = iVar8 + uVar4;
  if (0xfe < (int)(iVar8 + uVar4)) {
    iVar9 = 0xff;
  }
  (pBlock_colors->field_0).m_comps[3] = 0xff;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  iVar8 = iVar8 + (uint)uStack_28._6_1_;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar10 = (uint8_t)iVar8;
  if (iVar8 < 1) {
    uVar10 = '\0';
  }
  pBlock_colors[1].field_0.m_comps[0] = (uint8_t)iVar7;
  pBlock_colors[1].field_0.m_comps[1] = (uint8_t)iVar9;
  pBlock_colors[1].field_0.m_comps[2] = uVar10;
  pBlock_colors[1].field_0.m_comps[3] = 0xff;
  iVar9 = *(int *)(g_etc1_inten_tables + uVar6 + 8);
  iVar7 = iVar9 + uVar2;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = iVar3;
  }
  iVar8 = iVar9 + uVar4;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar10 = (uint8_t)iVar8;
  if (iVar8 < 1) {
    uVar10 = '\0';
  }
  iVar9 = iVar9 + (uint)uStack_28._6_1_;
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  if (iVar9 < 1) {
    iVar9 = iVar3;
  }
  pBlock_colors[2].field_0.m_comps[0] = (uint8_t)iVar7;
  pBlock_colors[2].field_0.m_comps[1] = uVar10;
  pBlock_colors[2].field_0.m_comps[2] = (uint8_t)iVar9;
  pBlock_colors[2].field_0.m_comps[3] = 0xff;
  iVar7 = *(int *)(g_etc1_inten_tables + uVar6 + 0xc);
  iVar9 = uVar2 + iVar7;
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  uVar10 = (uint8_t)iVar9;
  if (iVar9 < 1) {
    uVar10 = '\0';
  }
  iVar9 = uVar4 + iVar7;
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  if (iVar9 < 1) {
    iVar9 = iVar3;
  }
  iVar7 = iVar7 + (uint)uStack_28._6_1_;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  uVar5 = (uint8_t)iVar7;
  if (iVar7 < 1) {
    uVar5 = '\0';
  }
  pBlock_colors[3].field_0.m_comps[0] = uVar10;
  pBlock_colors[3].field_0.m_comps[1] = (uint8_t)iVar9;
  pBlock_colors[3].field_0.m_comps[2] = uVar5;
  pBlock_colors[3].field_0.m_comps[3] = 0xff;
  return;
}

Assistant:

void get_block_colors_etc1s(color_rgba* pBlock_colors) const
		{
			color_rgba b;

			unpack_color5(b, get_base5_color(), true);

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(0)];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}